

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_sfp_plus_cable_technology(tcv_t *tcv,sfp_plus_cable_technology_t *technology)

{
  int iVar1;
  
  iVar1 = -4;
  if ((technology != (sfp_plus_cable_technology_t *)0x0 && tcv != (tcv_t *)0x0) &&
     (tcv->data != (void *)0x0)) {
    technology->bmp = '\0';
    technology->bmp = *(byte *)((long)tcv->data + 9) >> 2 & 3;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int sfp_get_sfp_plus_cable_technology(tcv_t *tcv, sfp_plus_cable_technology_t *technology)
{
	if (tcv == NULL || technology == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Clear bitmap */
	technology->bmp = 0;

	/* Fill bitmap */
	technology->bmp = (((sfp_data_t*)tcv->data)->a0[SFP_PLUS_TECH_REG] & SFP_PLUS_TECH_MASK) >> 2;

	return 0;
}